

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

void __thiscall Centaurus::ATNMachine<wchar_t>::drop_passthrough_nodes(ATNMachine<wchar_t> *this)

{
  pointer *ppAVar1;
  pointer pAVar2;
  iterator __position;
  byte bVar3;
  int iVar4;
  pointer pAVar5;
  ulong uVar6;
  ulong uVar7;
  ATNTransition<wchar_t> *t;
  pointer __args;
  pointer pAVar8;
  ulong uVar9;
  int where;
  int local_60;
  allocator_type local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_60 = CONCAT31(local_60._1_3_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             ((long)(this->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_nodes).
                    super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
             (bool *)&local_60,&local_59);
  pAVar5 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar8 = (this->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)pAVar5 - (long)pAVar8 >> 3) * -0x79435e50d79435e5;
  if (uVar6 - 3 < 0xfffffffffffffffe) {
    uVar9 = 1;
    do {
      if (uVar6 <= uVar9) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9
                  );
      }
      if (pAVar8[uVar9].m_type == Blank) {
        local_60 = -1;
        iVar4 = count_incoming_edges(this,(int)uVar9,&local_60);
        if (iVar4 == 1) {
          uVar6 = (ulong)local_60;
          if ((long)uVar6 < 0) {
            __assert_fail("where >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                          ,0x179,
                          "void Centaurus::ATNMachine<wchar_t>::drop_passthrough_nodes() [TCHAR = wchar_t]"
                         );
          }
          pAVar5 = (this->m_nodes).
                   super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(this->m_nodes).
                         super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 3) *
                  -0x79435e50d79435e5;
          if (uVar7 < uVar6 || uVar7 - uVar6 == 0) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          __args = pAVar8[uVar9].m_transitions.
                   super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar2 = *(pointer *)
                    ((long)&pAVar8[uVar9].m_transitions.
                            super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                            ._M_impl + 8);
          if (__args != pAVar2) {
            do {
              __position._M_current =
                   *(pointer *)
                    ((long)&pAVar5[uVar6].m_transitions.
                            super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                            ._M_impl + 8);
              if (__position._M_current ==
                  *(pointer *)
                   ((long)&pAVar5[uVar6].m_transitions.
                           super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                           ._M_impl + 0x10)) {
                std::
                vector<Centaurus::ATNTransition<wchar_t>,std::allocator<Centaurus::ATNTransition<wchar_t>>>
                ::_M_realloc_insert<Centaurus::ATNTransition<wchar_t>const&>
                          ((vector<Centaurus::ATNTransition<wchar_t>,std::allocator<Centaurus::ATNTransition<wchar_t>>>
                            *)&pAVar5[uVar6].m_transitions,__position,__args);
              }
              else {
                (__position._M_current)->_vptr_ATNTransition =
                     (_func_int **)&PTR__ATNTransition_0019b840;
                iVar4 = __args->m_dest;
                (__position._M_current)->m_type = __args->m_type;
                (__position._M_current)->m_dest = iVar4;
                (__position._M_current)->m_tag = __args->m_tag;
                ppAVar1 = (pointer *)
                          ((long)&pAVar5[uVar6].m_transitions.
                                  super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                                  ._M_impl + 8);
                *ppAVar1 = *ppAVar1 + 1;
              }
              __args = __args + 1;
            } while (__args != pAVar2);
          }
          bVar3 = (byte)uVar9 & 0x3f;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        pAVar8 = (this->m_nodes).
                 super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar5 = (this->m_nodes).
                 super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar9 = uVar9 + 1;
      uVar6 = ((long)pAVar5 - (long)pAVar8 >> 3) * -0x79435e50d79435e5;
    } while (uVar9 < uVar6 - 1);
  }
  filter_nodes(this,&local_58);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void drop_passthrough_nodes()
    {
        std::vector<bool> mask(m_nodes.size(), true);

        for (int i = 1; i < m_nodes.size() - 1; i++)
        {
            const ATNNode<TCHAR>& node = m_nodes.at(i);
            if (node.type() == ATNNodeType::Blank)
            {
                int where = -1;
                int count = count_incoming_edges(i, where);

                if (count == 1)
                {
                    assert(where >= 0);
                    ATNNode<TCHAR>& origin = m_nodes.at(where);
                    for (const auto& t : node.get_transitions())
                    {
                        origin.add_transition(t);
                    }
                    mask[i] = false;
                }
            }
        }

        filter_nodes(mask);
    }